

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O0

void __thiscall icu_63::RBBIRuleScanner::error(RBBIRuleScanner *this,UErrorCode e)

{
  UBool UVar1;
  UErrorCode e_local;
  RBBIRuleScanner *this_local;
  
  UVar1 = ::U_SUCCESS(*this->fRB->fStatus);
  if ((UVar1 != '\0') && (*this->fRB->fStatus = e, this->fRB->fParseError != (UParseError *)0x0)) {
    this->fRB->fParseError->line = this->fLineNum;
    this->fRB->fParseError->offset = this->fCharNum;
    this->fRB->fParseError->preContext[0] = L'\0';
    this->fRB->fParseError->postContext[0] = L'\0';
  }
  return;
}

Assistant:

void RBBIRuleScanner::error(UErrorCode e) {
    if (U_SUCCESS(*fRB->fStatus)) {
        *fRB->fStatus = e;
        if (fRB->fParseError) {
            fRB->fParseError->line  = fLineNum;
            fRB->fParseError->offset = fCharNum;
            fRB->fParseError->preContext[0] = 0;
            fRB->fParseError->postContext[0] = 0;
        }
    }
}